

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_571eba::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  string local_1b0 [32];
  ostringstream oss;
  
  if (0.0 < total) {
    lVar1 = this->CurrentPercentage;
    lVar2 = lround((value / total) * 100.0);
    lVar4 = 100;
    if (lVar2 < 100) {
      lVar4 = lVar2;
    }
    this->CurrentPercentage = lVar4;
    if (lVar1 != lVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"[");
      poVar3 = std::operator<<(poVar3,(string *)&this->Text);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::operator<<(poVar3,"% complete]");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)status,local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      return true;
    }
  }
  return false;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0.0) {
      this->CurrentPercentage = std::lround(value / total * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      std::ostringstream oss;
      oss << "[" << this->Text << " " << this->CurrentPercentage
          << "% complete]";
      status = oss.str();
    }

    return updated;
  }